

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void destroyBindings(BINDING *bindings,XML_Parser parser)

{
  XML_Parser pXVar1;
  BINDING *b;
  XML_Parser parser_local;
  BINDING *bindings_local;
  
  parser_local = (XML_Parser)bindings;
  while (parser_local != (XML_Parser)0x0) {
    pXVar1 = (XML_Parser)parser_local->m_handlerArg;
    (*(parser->m_mem).free_fcn)((parser_local->m_mem).realloc_fcn);
    (*(parser->m_mem).free_fcn)(parser_local);
    parser_local = pXVar1;
  }
  return;
}

Assistant:

static void FASTCALL
destroyBindings(BINDING *bindings, XML_Parser parser)
{
  for (;;) {
    BINDING *b = bindings;
    if (!b)
      break;
    bindings = b->nextTagBinding;
    FREE(b->uri);
    FREE(b);
  }
}